

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxTrackBuilder.cpp
# Opt level: O2

void __thiscall FluxTrackBuilder::addWeakBlock(FluxTrackBuilder *this,int length)

{
  undefined8 in_RAX;
  ulong uVar1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  addRawBit(this,true);
  addRawBit(this,true);
  for (uVar1 = (long)(length * 0x15) / 2 & 0xffffffff; 0 < (int)uVar1;
      uVar1 = (ulong)((int)uVar1 - 1)) {
    uStack_28 = CONCAT44(this->m_bitcell_ns * 3 >> 1,(undefined4)uStack_28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->m_flux_times,(uint *)((long)&uStack_28 + 4));
  }
  return;
}

Assistant:

void FluxTrackBuilder::addWeakBlock(int length)
{
    // Flush out previous constant block.
    addRawBit(1);
    addRawBit(1);

    // Approximately 11 ambigious reversals per weak byte.
    length = length * 21 / 2;

    while (length-- > 0)
        m_flux_times.push_back(m_bitcell_ns * 3 / 2);
}